

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O2

int h261_gob(bitstream *str,h261_gob *gob)

{
  h261_macroblock *val;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t ival;
  uint32_t *puVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint32_t mba;
  uint32_t local_60;
  uint32_t gei;
  long local_58;
  uint32_t *local_50;
  int32_t (*local_48) [64];
  h261_macroblock *local_40;
  h261_macroblock *local_38;
  
  iVar1 = vs_u(str,&gob->gquant,5);
  if (iVar1 != 0) {
    return 1;
  }
  gei = 0;
  iVar1 = vs_u(str,&gei,1);
  if (iVar1 != 0) {
    return 1;
  }
  while (gei != 0) {
    iVar1 = vs_u(str,&gei,8);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = vs_u(str,&gei,1);
    if (iVar1 != 0) {
      return 1;
    }
  }
  local_60 = gob->gquant;
  local_38 = gob->mbs;
  local_50 = &gob->mbs[0].cbp;
  uVar5 = 0;
  do {
    mba = 0;
    if (str->dir == VS_ENCODE) {
      uVar5 = (ulong)(int)uVar5;
      puVar4 = local_50 + uVar5 * 0x185;
      for (; (long)uVar5 < 0x21; uVar5 = uVar5 + 1) {
        if (((h261_macroblock *)(puVar4 + -4))->mtype != 0) goto LAB_0010254a;
        iVar1 = vs_infer(str,puVar4,0);
        if (iVar1 != 0) {
          return 1;
        }
        mba = mba + 1;
        puVar4 = puVar4 + 0x185;
      }
      if (uVar5 == 0x21) {
        return 0;
      }
    }
LAB_0010254a:
    iVar1 = (int)uVar5;
    while( true ) {
      iVar2 = vs_vlc(str,&mba,mba_vlc);
      if (iVar2 != 0) {
        return 1;
      }
      lVar6 = (long)iVar1;
      if ((str->dir == VS_ENCODE) || (mba < 0x21)) break;
      if (mba != 0x21) {
        lVar7 = lVar6 + -1;
        puVar4 = &gob->mbs[lVar6].cbp;
        do {
          lVar7 = lVar7 + 1;
          if (0x20 < lVar7) {
            return 0;
          }
          ((h261_macroblock *)(puVar4 + -4))->mtype = 0;
          iVar1 = vs_infer(str,puVar4,0);
          puVar4 = puVar4 + 0x185;
        } while (iVar1 == 0);
        return 1;
      }
    }
    if (str->dir == VS_DECODE) {
      puVar4 = local_50 + lVar6 * 0x185;
      for (; (lVar6 < 0x21 && (mba != 0)); mba = mba - 1) {
        ((h261_macroblock *)(puVar4 + -4))->mtype = 0;
        iVar1 = vs_infer(str,puVar4,0);
        if (iVar1 != 0) {
          return 1;
        }
        lVar6 = lVar6 + 1;
        puVar4 = puVar4 + 0x185;
      }
      iVar1 = (int)lVar6;
      if (lVar6 == 0x21) {
        fwrite("Macroblock address overrun\n",0x1b,1,_stderr);
        return 1;
      }
    }
    local_58 = (long)iVar1 * 0x614;
    val = local_38 + iVar1;
    iVar2 = vs_vlc(str,&val->mtype,mtype_vlc);
    if (iVar2 != 0) {
      return 1;
    }
    if ((val->mtype & 3) != 0) {
      puVar4 = &val->mquant;
      if ((val->mtype & 4) == 0) {
        iVar2 = vs_infer(str,puVar4,local_60);
        if (iVar2 != 0) {
          return 1;
        }
      }
      else {
        iVar2 = vs_u(str,puVar4,5);
        if (iVar2 != 0) {
          return 1;
        }
        local_60 = *puVar4;
      }
    }
    uVar3 = val->mtype;
    if ((uVar3 & 8) != 0) {
      iVar2 = vs_vlc(str,val->mvd,mvd_vlc);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = vs_vlc(str,val->mvd + 1,mvd_vlc);
      if (iVar2 != 0) {
        return 1;
      }
      uVar3 = val->mtype;
    }
    if ((uVar3 & 1) == 0) {
      if ((uVar3 & 2) == 0) {
        ival = 0;
      }
      else {
        ival = 0x3f;
      }
      iVar2 = vs_infer(str,&val->cbp,ival);
    }
    else {
      iVar2 = vs_vlc(str,&val->cbp,cbp_vlc);
    }
    if (iVar2 != 0) {
      return 1;
    }
    local_48 = val->block;
    local_58 = (long)gob->mbs[0].mvd + local_58 + -0x10;
    local_40 = val;
    for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
      if ((local_40->cbp >> ((uint)lVar6 & 0x1f) & 1) == 0) {
        lVar7 = 0x1c;
        while (lVar7 + 4 != 0x120) {
          iVar2 = vs_infers(str,(int32_t *)(lVar7 + local_58),0);
          lVar7 = lVar7 + 4;
          if (iVar2 != 0) {
            return 1;
          }
        }
      }
      else {
        iVar2 = h261_block(str,local_48[lVar6],local_40->mtype & 2);
        if (iVar2 != 0) {
          return 1;
        }
      }
      local_58 = local_58 + 0x100;
    }
    uVar5 = (ulong)(iVar1 + 1);
  } while( true );
}

Assistant:

int h261_gob(struct bitstream *str, struct h261_gob *gob) {
	if (vs_u(str, &gob->gquant, 5)) return 1;
	uint32_t gei = 0;
	if (vs_u(str, &gei, 1)) return 1;
	while (gei) {
		if (vs_u(str, &gei, 8)) return 1;
		if (vs_u(str, &gei, 1)) return 1;
	}
	int mbi = 0;
	uint32_t quant = gob->gquant;
	while (1) {
		uint32_t mba = 0;
		if (str->dir == VS_ENCODE) {
			while (mbi < H261_GOB_MBS && gob->mbs[mbi].mtype == 0) {
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba++;
			}
		       	if (mbi == H261_GOB_MBS)
				return 0;
		}
		while (1) {
			if (vs_vlc(str, &mba, mba_vlc)) return 1;
			if (str->dir == VS_ENCODE || mba < 33)
				break;
			if (mba == 33) /* stuffing */
				continue;
			/* end */
			while (mbi < H261_GOB_MBS) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++;
			}
			return 0;
		}
		if (str->dir == VS_DECODE) {
			while (mbi < H261_GOB_MBS && mba) {
				gob->mbs[mbi].mtype = 0;
				if (vs_infer(str, &gob->mbs[mbi].cbp, 0)) return 1;
				mbi++, mba--;
			}
			if (mbi == H261_GOB_MBS) {
				fprintf(stderr, "Macroblock address overrun\n");
				return 1;
			}
		}
		struct h261_macroblock *mb = &gob->mbs[mbi];
		if (vs_vlc(str, &mb->mtype, mtype_vlc)) return 1;
		if (mb->mtype & (H261_MTYPE_FLAG_CODED | H261_MTYPE_FLAG_INTRA)) {
			if (mb->mtype & H261_MTYPE_FLAG_QUANT) {
				if (vs_u(str, &mb->mquant, 5)) return 1;
				quant = mb->mquant;
			} else {
				if (vs_infer(str, &mb->mquant, quant)) return 1;
			}
		}
		if (mb->mtype & H261_MTYPE_FLAG_MC) {
			if (vs_vlc(str, &mb->mvd[0], mvd_vlc)) return 1;
			if (vs_vlc(str, &mb->mvd[1], mvd_vlc)) return 1;
		}
		if (mb->mtype & H261_MTYPE_FLAG_CODED) {
			if (vs_vlc(str, &mb->cbp, cbp_vlc)) return 1;
		} else if (mb->mtype & H261_MTYPE_FLAG_INTRA) {
			if (vs_infer(str, &mb->cbp, 0x3f)) return 1;
		} else {
			if (vs_infer(str, &mb->cbp, 0)) return 1;
		}
		int j, k;
		for (j = 0; j < 6; j++) {
			if (mb->cbp & (1 << j)) {
				if (h261_block(str, mb->block[j], mb->mtype & H261_MTYPE_FLAG_INTRA)) return 1;
			} else {
				for (k = 0; k < 64; k++)
					if (vs_infers(str, &mb->block[j][k], 0)) return 1;
			}
		}
		mbi++;
	}
	return 0;
}